

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O1

void kj::_::Debug::log<char_const(&)[43],kj::_::DebugExpression<bool>&>
               (char *file,int line,LogSeverity severity,char *macroArgs,char (*params) [43],
               DebugExpression<bool> *params_1)

{
  long lVar1;
  undefined8 uVar2;
  undefined4 in_register_00000014;
  long lVar3;
  String *result;
  String argValues [2];
  ArrayPtr<kj::String> in_stack_ffffffffffffff98;
  char *pcStack_58;
  String local_50;
  
  str<char_const(&)[43]>
            ((String *)&stack0xffffffffffffff98,(kj *)params,
             (char (*) [43])CONCAT44(in_register_00000014,severity));
  heapString(&local_50,5);
  if ((char *)local_50.content.size_ != (char *)0x0) {
    local_50.content.size_ = (size_t)local_50.content.ptr;
  }
  builtin_strncpy((char *)local_50.content.size_,"false",5);
  logInternal((Debug *)file,(char *)(ulong)(uint)line,severity,(LogSeverity)macroArgs,
              &stack0xffffffffffffff98,in_stack_ffffffffffffff98);
  lVar3 = 0x18;
  do {
    lVar1 = *(long *)(&stack0xffffffffffffff98 + lVar3);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)(&stack0xffffffffffffffa0 + lVar3);
      *(undefined8 *)(&stack0xffffffffffffff98 + lVar3) = 0;
      *(undefined8 *)(&stack0xffffffffffffffa0 + lVar3) = 0;
      (**(code **)**(undefined8 **)((long)&pcStack_58 + lVar3))
                (*(undefined8 **)((long)&pcStack_58 + lVar3),lVar1,1,uVar2,uVar2,0);
    }
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  return;
}

Assistant:

void Debug::log(const char* file, int line, LogSeverity severity, const char* macroArgs,
                Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  logInternal(file, line, severity, macroArgs, arrayPtr(argValues, sizeof...(Params)));
}